

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

void stressTest(void)

{
  initializer_list<double> __l;
  ostream *this;
  allocator<double> local_c9;
  double local_c8 [6];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> input;
  NeuralNet nn;
  int local_48 [8];
  activationType local_28 [2];
  undefined1 local_20 [8];
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> layerDefs;
  
  std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::vector
            ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)local_20
            );
  local_28[1] = 0x32;
  local_28[0] = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             (int *)(local_28 + 1),local_28);
  local_48[4] = 0x32;
  local_48[3] = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             (int *)((long)local_48 + 0x10),(activationType *)((long)local_48 + 0xc));
  local_48[2] = 0x32;
  local_48[1] = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             (int *)((long)local_48 + 8),(activationType *)((long)local_48 + 4));
  local_48[0] = 2;
  nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             local_48,(activationType *)
                      ((long)&nn.layers.
                              super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  PyreNet::NeuralNet::NeuralNet
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,5,
             (vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)local_20
            );
  PyreNet::NeuralNet::mutate_uniform
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,0.1,-1);
  local_c8[2] = 2.0;
  local_c8[3] = 3.0;
  local_c8[0] = 0.0;
  local_c8[1] = 1.0;
  local_c8[4] = 4.0;
  local_98 = local_c8;
  local_90 = 5;
  std::allocator<double>::allocator(&local_c9);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,__l,&local_c9);
  std::allocator<double>::~allocator(&local_c9);
  this = std::operator<<((ostream *)&std::cout,"Stress test complete");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  PyreNet::NeuralNet::~NeuralNet
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::~vector
            ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)local_20
            );
  return;
}

Assistant:

void stressTest() {
    std::vector<PyreNet::LayerDefinition> layerDefs;
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(2, PyreNet::LayerDefinition::activationType::relu);
    PyreNet::NeuralNet nn(5, layerDefs);
    nn.mutate_uniform(0, 0.1);
    std::vector<double> input{0,1,2,3,4};
    std::cout << "Stress test complete" << std::endl;
}